

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O1

extent_t *
extent_try_coalesce_impl
          (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,rtree_ctx_t *rtree_ctx,
          extents_t *extents,extent_t *extent,_Bool *coalesced,_Bool growing_retained,
          _Bool inactive_only)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  uint uVar4;
  extent_t *peVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  byte bVar10;
  extents_t *extents_00;
  extent_t *local_48;
  
  extents_00 = extents;
  do {
    peVar5 = extent_lock_from_addr
                       (tsdn,rtree_ctx,
                        (void *)(((extent->field_2).e_size_esn & 0xfffffffffffff000) +
                                ((ulong)extent->e_addr & 0xfffffffffffff000)),growing_retained);
    if (peVar5 == (extent_t *)0x0) {
      bVar2 = false;
LAB_0012fd1a:
      peVar5 = extent_lock_from_addr
                         (tsdn,rtree_ctx,
                          (void *)(((ulong)extent->e_addr & 0xfffffffffffff000) - 0x1000),
                          growing_retained);
      bVar1 = true;
      if (peVar5 != (extent_t *)0x0) {
        if (((arena_t *)arenas[(uint)peVar5->e_bits & 0xfff].repr == arena) &&
           (((extent_state_t)(peVar5->e_bits >> 0x10) & extent_state_retained) == extents->state)) {
          bVar10 = ((uint)peVar5->e_bits >> 0xd & 1) == 0 ^
                   (*(byte *)((long)&extent->e_bits + 1) & 0x20) >> 5;
        }
        else {
          bVar10 = 0;
        }
        uVar6 = ((long)peVar5 * -0x775ed61580000000 |
                (ulong)((long)peVar5 * -0x783c846eeebdac2b) >> 0x21) * 0x4cf5ad432745937f ^
                0xd50dcc13;
        uVar8 = uVar6 + 0xd50dcc13;
        uVar6 = uVar6 + 0x1aa1b9826;
        uVar8 = (uVar8 >> 0x21 ^ uVar8) * -0xae502812aa7333;
        lVar9 = (uVar8 >> 0x21 ^ uVar8) * -0x3b314601e57a13ad;
        uVar6 = (uVar6 >> 0x21 ^ uVar6) * -0xae502812aa7333;
        lVar7 = (uVar6 >> 0x21 ^ uVar6) * -0x3b314601e57a13ad;
        uVar4 = ((uint)((ulong)lVar7 >> 0x21) ^ (uint)lVar7) +
                ((uint)((ulong)lVar9 >> 0x21) ^ (uint)lVar9) & 0xff;
        extent_mutex_pool.mutexes[uVar4].field_0.field_0.locked.repr = false;
        extents = extents_00;
        pthread_mutex_unlock
                  ((pthread_mutex_t *)((long)&extent_mutex_pool.mutexes[uVar4].field_0 + 0x40));
        extents_00 = extents;
        bVar1 = true;
        if ((bVar10 != 0) &&
           (_Var3 = extent_coalesce(tsdn,arena,r_extent_hooks,extents,extent,peVar5,false,
                                    SUB81(extents,0)), bVar1 = true, !_Var3)) {
          extent = peVar5;
          if (extents->delay_coalesce == true) {
            *coalesced = true;
            local_48 = peVar5;
            bVar1 = false;
          }
          else {
            bVar2 = true;
            bVar1 = true;
          }
        }
      }
    }
    else {
      if (((arena_t *)arenas[(uint)peVar5->e_bits & 0xfff].repr == arena) &&
         (((extent_state_t)(peVar5->e_bits >> 0x10) & extent_state_retained) == extents->state)) {
        bVar10 = ((uint)peVar5->e_bits >> 0xd & 1) == 0 ^
                 (*(byte *)((long)&extent->e_bits + 1) & 0x20) >> 5;
      }
      else {
        bVar10 = 0;
      }
      uVar6 = ((long)peVar5 * -0x775ed61580000000 |
              (ulong)((long)peVar5 * -0x783c846eeebdac2b) >> 0x21) * 0x4cf5ad432745937f ^ 0xd50dcc13
      ;
      uVar8 = uVar6 + 0xd50dcc13;
      uVar6 = uVar6 + 0x1aa1b9826;
      uVar8 = (uVar8 >> 0x21 ^ uVar8) * -0xae502812aa7333;
      lVar9 = (uVar8 >> 0x21 ^ uVar8) * -0x3b314601e57a13ad;
      uVar6 = (uVar6 >> 0x21 ^ uVar6) * -0xae502812aa7333;
      lVar7 = (uVar6 >> 0x21 ^ uVar6) * -0x3b314601e57a13ad;
      uVar4 = ((uint)((ulong)lVar7 >> 0x21) ^ (uint)lVar7) +
              ((uint)((ulong)lVar9 >> 0x21) ^ (uint)lVar9) & 0xff;
      extent_mutex_pool.mutexes[uVar4].field_0.field_0.locked.repr = false;
      pthread_mutex_unlock
                ((pthread_mutex_t *)((long)&extent_mutex_pool.mutexes[uVar4].field_0 + 0x40));
      bVar1 = true;
      extents = extents_00;
      if ((bVar10 == 0) ||
         (_Var3 = extent_coalesce(tsdn,arena,r_extent_hooks,extents_00,extent,peVar5,true,
                                  SUB81(extents_00,0)), _Var3)) {
        bVar2 = false;
      }
      else {
        bVar2 = true;
        bVar1 = true;
        if (extents_00->delay_coalesce == true) {
          *coalesced = true;
          bVar2 = false;
          bVar1 = false;
          local_48 = extent;
        }
      }
      extents_00 = extents;
      if (bVar1) goto LAB_0012fd1a;
      bVar1 = false;
    }
    if (!bVar1) {
      return local_48;
    }
    if (!bVar2) {
      if (extents->delay_coalesce == true) {
        *coalesced = false;
      }
      return extent;
    }
  } while( true );
}

Assistant:

static extent_t *
extent_try_coalesce_impl(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, rtree_ctx_t *rtree_ctx, extents_t *extents,
    extent_t *extent, bool *coalesced, bool growing_retained,
    bool inactive_only) {
	/*
	 * We avoid checking / locking inactive neighbors for large size
	 * classes, since they are eagerly coalesced on deallocation which can
	 * cause lock contention.
	 */
	/*
	 * Continue attempting to coalesce until failure, to protect against
	 * races with other threads that are thwarted by this one.
	 */
	bool again;
	do {
		again = false;

		/* Try to coalesce forward. */
		extent_t *next = extent_lock_from_addr(tsdn, rtree_ctx,
		    extent_past_get(extent), inactive_only);
		if (next != NULL) {
			/*
			 * extents->mtx only protects against races for
			 * like-state extents, so call extent_can_coalesce()
			 * before releasing next's pool lock.
			 */
			bool can_coalesce = extent_can_coalesce(arena, extents,
			    extent, next);

			extent_unlock(tsdn, next);

			if (can_coalesce && !extent_coalesce(tsdn, arena,
			    r_extent_hooks, extents, extent, next, true,
			    growing_retained)) {
				if (extents->delay_coalesce) {
					/* Do minimal coalescing. */
					*coalesced = true;
					return extent;
				}
				again = true;
			}
		}

		/* Try to coalesce backward. */
		extent_t *prev = extent_lock_from_addr(tsdn, rtree_ctx,
		    extent_before_get(extent), inactive_only);
		if (prev != NULL) {
			bool can_coalesce = extent_can_coalesce(arena, extents,
			    extent, prev);
			extent_unlock(tsdn, prev);

			if (can_coalesce && !extent_coalesce(tsdn, arena,
			    r_extent_hooks, extents, extent, prev, false,
			    growing_retained)) {
				extent = prev;
				if (extents->delay_coalesce) {
					/* Do minimal coalescing. */
					*coalesced = true;
					return extent;
				}
				again = true;
			}
		}
	} while (again);

	if (extents->delay_coalesce) {
		*coalesced = false;
	}
	return extent;
}